

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O1

int Col_StringBufferAppendSequence(Col_Word strbuf,ColRopeIterator *begin,ColRopeIterator *end)

{
  int iVar1;
  Col_Char c;
  uint uVar2;
  Col_Word rope;
  undefined8 uVar3;
  uint uVar4;
  Col_RopeIterator it;
  ColRopeIterator local_68;
  
  iVar1 = Col_RopeIterCompare(begin,end);
  uVar4 = 1;
  if (iVar1 < 0) {
    if (strbuf == 0) {
      uVar4 = 0;
    }
    else if ((strbuf & 0xf) == 0) {
      uVar4 = -(uint)((*(byte *)strbuf & 2) == 0) | *(byte *)strbuf & 0xfffffffe;
    }
    else {
      uVar4 = immediateWordTypes[(uint)strbuf & 0x1f];
    }
    if ((uVar4 == 2) && ((*(byte *)(strbuf + 2) & 0xc) == 0)) {
      strbuf = *(Col_Word *)(strbuf + 0x10);
    }
    if (begin->rope != 0) {
      if (((ulong)*(ushort *)(strbuf + 2) * 0x20 - 0x18) / (ulong)(*(byte *)(strbuf + 1) & 7) -
          *(long *)(strbuf + 0x10) < end->index - begin->index) {
        rope = Col_Subrope(begin->rope,begin->index,end->index - 1);
        iVar1 = Col_StringBufferAppendRope(strbuf,rope);
        return iVar1;
      }
    }
    local_68.rope = begin->rope;
    local_68.length = begin->length;
    local_68.index = begin->index;
    local_68.chunk.first = (begin->chunk).first;
    local_68.chunk.last = (begin->chunk).last;
    local_68.chunk.accessProc = (begin->chunk).accessProc;
    local_68.chunk.current.access.leaf = (begin->chunk).current.access.leaf;
    local_68.chunk.current.access.index = (size_t)(begin->chunk).current.direct.address;
    iVar1 = Col_RopeIterCompare(&local_68,end);
    uVar4 = 1;
    while (iVar1 < 0) {
      if ((local_68.index < local_68.chunk.first) || (local_68.chunk.last < local_68.index)) {
        c = ColRopeIterUpdateTraversalInfo(&local_68);
      }
      else if ((code *)local_68.chunk.accessProc == (code *)0x0) {
        c = 0xffffffff;
        if ((int)local_68.chunk.current.direct.format < 4) {
          if (local_68.chunk.current.direct.format == COL_UCS1) {
            c = (Col_Char)(byte)*local_68.chunk.current.direct.address;
          }
          else if (local_68.chunk.current.direct.format == COL_UCS2) {
            c = (Col_Char)(ushort)*local_68.chunk.current.direct.address;
          }
        }
        else if (local_68.chunk.current.direct.format == COL_UCS4) {
          c = *local_68.chunk.current.direct.address;
        }
        else if (local_68.chunk.current.direct.format == COL_UTF8) {
          c = Col_Utf8Get((Col_Char1 *)local_68.chunk.current.direct.address);
        }
        else if (local_68.chunk.current.direct.format == COL_UTF16) {
          c = Col_Utf16Get((Col_Char2 *)local_68.chunk.current.direct.address);
        }
      }
      else {
        c = (*(code *)local_68.chunk.accessProc)
                      (local_68.chunk.current.access.leaf,local_68.chunk.current.access.index);
      }
      uVar2 = Col_StringBufferAppendChar(strbuf,c);
      if ((local_68.index < local_68.chunk.first) || (local_68.chunk.last <= local_68.index)) {
        Col_RopeIterForward(&local_68,1);
        uVar3 = local_68.chunk.current.direct.address;
      }
      else {
        local_68.index = local_68.index + 1;
        if ((code *)local_68.chunk.accessProc == (code *)0x0) {
          if ((int)local_68.chunk.current.direct.format < 4) {
            if (local_68.chunk.current.direct.format == COL_UCS1) {
              uVar3 = (Col_Char *)(local_68.chunk.current.access.index + 1);
            }
            else {
              uVar3 = (Col_Char *)0x0;
              if (local_68.chunk.current.direct.format == COL_UCS2) {
                uVar3 = (Col_Char *)(local_68.chunk.current.access.index + 2);
              }
            }
          }
          else if (local_68.chunk.current.direct.format == COL_UCS4) {
            uVar3 = (Col_Char *)(local_68.chunk.current.access.index + 4);
          }
          else if (local_68.chunk.current.direct.format == COL_UTF8) {
            uVar3 = Col_Utf8Next((Col_Char1 *)local_68.chunk.current.direct.address);
          }
          else {
            uVar3 = (Col_Char *)0x0;
            if (local_68.chunk.current.direct.format == COL_UTF16) {
              uVar3 = Col_Utf16Next((Col_Char2 *)local_68.chunk.current.direct.address);
            }
          }
        }
        else {
          uVar3 = (Col_Char *)(local_68.chunk.current.access.index + 1);
        }
      }
      local_68.chunk.current.direct.address = (void *)uVar3;
      uVar4 = uVar4 & uVar2;
      iVar1 = Col_RopeIterCompare(&local_68,end);
    }
  }
  return uVar4;
}

Assistant:

int
Col_StringBufferAppendSequence(
    Col_Word strbuf,                /*!< String buffer to append character
                                         sequence to. */
    const Col_RopeIterator begin,   /*!< First character in sequence. */
    const Col_RopeIterator end)     /*!< First character past sequence end. */
{
    Col_StringFormat format;
    Col_Word rope;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return 0;

    if (Col_RopeIterCompare(begin, end) >= 0) {
        /*
         * Nothing to do.
         */

        return 1;
    }

    WORD_UNWRAP(strbuf);

    rope = Col_RopeIterRope(begin);
    format = (Col_StringFormat) WORD_STRBUF_FORMAT(strbuf);
    if (!rope || (Col_RopeIterIndex(end) - Col_RopeIterIndex(begin))
            <= STRBUF_MAX_LENGTH(WORD_STRBUF_SIZE(strbuf)
            * CELL_SIZE, format) - WORD_STRBUF_LENGTH(strbuf)) {
        /*
         * Sequence is in string mode or fits into buffer, append
         * character-wise.
         */

        Col_RopeIterator it;
        int noLoss = 1;
        for (Col_RopeIterSet(it, begin); Col_RopeIterCompare(it, end) < 0;
                Col_RopeIterNext(it)) {
            noLoss &= Col_StringBufferAppendChar(strbuf, Col_RopeIterAt(it));
        }
        return noLoss;
    }

    /*
     * Append subrope.
     */

    return Col_StringBufferAppendRope(strbuf, Col_Subrope(rope,
            Col_RopeIterIndex(begin), Col_RopeIterIndex(end)-1));
}